

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  int iVar5;
  int iVar6;
  array_container_t *src_1;
  byte bVar7;
  byte bVar8;
  array_container_t *array2;
  array_container_t *paVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint64_t uVar19;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar18 = 0;
  if (iVar2 < 1 || iVar1 < 1) {
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    uVar16 = 0;
    do {
      puVar3 = (x1->high_low_container).keys;
      uVar17 = (uint)uVar18;
      uVar10 = uVar17 & 0xffff;
      uVar13 = puVar3[uVar10];
      puVar4 = (x2->high_low_container).keys;
      uVar15 = (uint)uVar16;
      uVar12 = uVar15 & 0xffff;
      uVar14 = puVar4[uVar12];
      if (uVar13 != uVar14) {
        if (uVar13 < uVar14) {
          uVar15 = (x1->high_low_container).size;
          uVar10 = uVar17 + 1;
          if (((int)uVar10 < (int)uVar15) && (puVar3[(int)uVar10] < uVar14)) {
            uVar17 = uVar17 + 2;
            iVar6 = 1;
            if ((int)uVar17 < (int)uVar15) {
              iVar6 = 1;
              do {
                uVar18 = (ulong)uVar17;
                uVar13 = puVar3[(int)uVar17];
                if (uVar14 <= uVar13) goto LAB_0011c532;
                iVar5 = iVar6 * 2;
                uVar17 = uVar10 + iVar6 * 2;
                iVar6 = iVar5;
              } while ((int)uVar17 < (int)uVar15);
            }
            uVar13 = puVar3[(long)(int)uVar15 + -1];
            uVar18 = (long)(int)uVar15 - 1;
LAB_0011c532:
            if (uVar13 != uVar14) {
              if (uVar13 < uVar14) {
                uVar18 = (ulong)uVar15;
              }
              else if ((iVar6 >> 1) + uVar10 + 1 != (int)uVar18) {
                uVar10 = (iVar6 >> 1) + uVar10;
                do {
                  uVar17 = (int)(uVar10 + (int)uVar18) >> 1;
                  if (puVar3[(int)uVar17] == uVar14) {
                    uVar18 = (ulong)uVar17;
                    break;
                  }
                  if (uVar14 <= puVar3[(int)uVar17]) {
                    uVar18 = (ulong)uVar17;
                    uVar17 = uVar10;
                  }
                  uVar10 = uVar17;
                } while (uVar10 + 1 != (int)uVar18);
              }
            }
          }
          else {
            uVar18 = (ulong)uVar10;
          }
        }
        else {
          uVar17 = (x2->high_low_container).size;
          uVar10 = uVar15 + 1;
          if (((int)uVar10 < (int)uVar17) && (puVar4[(int)uVar10] < uVar13)) {
            uVar15 = uVar15 + 2;
            iVar6 = 1;
            if ((int)uVar15 < (int)uVar17) {
              iVar6 = 1;
              do {
                uVar16 = (ulong)uVar15;
                uVar14 = puVar4[(int)uVar15];
                if (uVar13 <= uVar14) goto LAB_0011c5a1;
                iVar5 = iVar6 * 2;
                uVar15 = uVar10 + iVar6 * 2;
                iVar6 = iVar5;
              } while ((int)uVar15 < (int)uVar17);
            }
            uVar14 = puVar4[(long)(int)uVar17 + -1];
            uVar16 = (long)(int)uVar17 - 1;
LAB_0011c5a1:
            if (uVar14 != uVar13) {
              if (uVar14 < uVar13) {
                uVar16 = (ulong)uVar17;
              }
              else if ((iVar6 >> 1) + uVar10 + 1 != (int)uVar16) {
                uVar10 = (iVar6 >> 1) + uVar10;
                do {
                  uVar17 = (int)(uVar10 + (int)uVar16) >> 1;
                  if (puVar4[(int)uVar17] == uVar13) {
                    uVar16 = (ulong)uVar17;
                    break;
                  }
                  if (uVar13 <= puVar4[(int)uVar17]) {
                    uVar16 = (ulong)uVar17;
                    uVar17 = uVar10;
                  }
                  uVar10 = uVar17;
                } while (uVar10 + 1 != (int)uVar16);
              }
            }
          }
          else {
            uVar16 = (ulong)uVar10;
          }
        }
        goto LAB_0011c69b;
      }
      bVar7 = (x1->high_low_container).typecodes[uVar10];
      src_1 = (array_container_t *)(x1->high_low_container).containers[uVar10];
      bVar8 = (x2->high_low_container).typecodes[uVar12];
      array2 = (array_container_t *)(x2->high_low_container).containers[uVar12];
      if (bVar7 == 4) {
        bVar7 = *(byte *)&src_1->array;
        if (bVar7 == 4) goto LAB_0011c72e;
        src_1 = *(array_container_t **)src_1;
      }
      if (bVar8 == 4) {
        bVar8 = *(byte *)&array2->array;
        if (bVar8 == 4) {
LAB_0011c72e:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        array2 = *(array_container_t **)array2;
      }
      switch((uint)bVar8 + (uint)bVar7 * 4) {
      case 5:
        iVar6 = bitset_container_and_justcard
                          ((bitset_container_t *)src_1,(bitset_container_t *)array2);
        break;
      case 6:
        if ((long)array2->cardinality < 1) {
LAB_0011c6ab:
          iVar6 = 0;
        }
        else {
          lVar11 = 0;
          iVar6 = 0;
          do {
            iVar6 = iVar6 + (uint)((*(ulong *)(src_1->array +
                                              (ulong)(array2->array[lVar11] >> 6) * 4) >>
                                    ((ulong)array2->array[lVar11] & 0x3f) & 1) != 0);
            lVar11 = lVar11 + 1;
          } while (array2->cardinality != lVar11);
        }
        break;
      case 7:
        paVar9 = src_1;
        goto LAB_0011c680;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1369,
                      "int container_and_cardinality(const container_t *, uint8_t, const container_t *, uint8_t)"
                     );
      case 9:
        if ((long)src_1->cardinality < 1) goto LAB_0011c6ab;
        lVar11 = 0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + (uint)((*(ulong *)(array2->array + (ulong)(src_1->array[lVar11] >> 6) * 4)
                                  >> ((ulong)src_1->array[lVar11] & 0x3f) & 1) != 0);
          lVar11 = lVar11 + 1;
        } while (src_1->cardinality != lVar11);
        break;
      case 10:
        iVar6 = array_container_intersection_cardinality(src_1,array2);
        break;
      case 0xb:
        paVar9 = array2;
        goto LAB_0011c5f9;
      case 0xd:
        paVar9 = array2;
        array2 = src_1;
LAB_0011c680:
        iVar6 = run_bitset_container_intersection_cardinality
                          ((run_container_t *)array2,(bitset_container_t *)paVar9);
        break;
      case 0xe:
        paVar9 = src_1;
        src_1 = array2;
LAB_0011c5f9:
        iVar6 = array_run_container_intersection_cardinality(src_1,(run_container_t *)paVar9);
        break;
      case 0xf:
        iVar6 = run_container_intersection_cardinality
                          ((run_container_t *)src_1,(run_container_t *)array2);
      }
      uVar19 = uVar19 + (long)iVar6;
      uVar18 = (ulong)(uVar17 + 1);
      uVar16 = (ulong)(uVar15 + 1);
LAB_0011c69b:
    } while (((int)uVar18 < iVar1) && ((int)uVar16 < iVar2));
  }
  return uVar19;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
        const uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}